

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O0

void __thiscall DFsScript::ClearSections(DFsScript *this)

{
  DFsSection *pDVar1;
  DFsSection *next;
  DFsSection *var;
  int i;
  DFsScript *this_local;
  
  for (var._4_4_ = 0; var._4_4_ < 0x11; var._4_4_ = var._4_4_ + 1) {
    next = ::TObjPtr::operator_cast_to_DFsSection_((TObjPtr *)(this->sections + var._4_4_));
    while (next != (DFsSection *)0x0) {
      pDVar1 = ::TObjPtr::operator_cast_to_DFsSection_((TObjPtr *)&next->next);
      (*(next->super_DObject)._vptr_DObject[4])();
      next = pDVar1;
    }
    TObjPtr<DFsSection>::operator=(this->sections + var._4_4_,(DFsSection *)0x0);
  }
  return;
}

Assistant:

void DFsScript::ClearSections()
{
	for(int i=0;i<SECTIONSLOTS;i++)
	{
		DFsSection * var = sections[i];
		while(var)
		{
			DFsSection *next = var->next;
			var->Destroy();
			var = next;
		}
		sections[i] = NULL;
	}
}